

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.h
# Opt level: O0

void __thiscall CChainParams::CChainParams(CChainParams *this)

{
  long lVar1;
  long in_RDI;
  CBlock *this_00;
  long in_FS_OFFSET;
  CCheckpointData *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  Params *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Consensus::Params::Params(in_stack_ffffffffffffffc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff88);
  local_28 = in_RDI + 0x1a8;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff88);
    local_28 = local_28 + 0x18;
  } while (local_28 != in_RDI + 0x220);
  this_00 = (CBlock *)(in_RDI + 0x220);
  std::__cxx11::string::string(in_stack_ffffffffffffffa0);
  CBlock::CBlock(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff88);
  CCheckpointData::CCheckpointData(in_stack_ffffffffffffff88);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::vector
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CChainParams() = default;